

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_pages_fuzzer.cc
# Opt level: O0

void __thiscall FuzzHelper::testPages(FuzzHelper *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  QPDFExc *e;
  QPDFFormFieldObjectHelper local_248;
  reference local_210;
  QPDFAnnotationObjectHelper *aoh;
  iterator __end2;
  iterator __begin2;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> local_1c0;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *local_1a8;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *__range2;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_198;
  JSON local_180;
  string local_170;
  undefined1 local_150 [8];
  QPDFObjectHandle page_obj;
  QPDFPageObjectHelper *local_100;
  QPDFPageObjectHelper *page;
  __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
  local_f0;
  iterator __end1;
  iterator __begin1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  int pageno;
  DiscardContents discard_contents;
  QPDFAcroFormDocumentHelper afdh;
  QPDFOutlineDocumentHelper odh;
  QPDFPageLabelDocumentHelper pldh;
  undefined1 local_40 [8];
  QPDFPageDocumentHelper pdh;
  shared_ptr<QPDF> q;
  FuzzHelper *this_local;
  
  this_00 = &pdh.m.super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  getQpdf((FuzzHelper *)this_00);
  peVar2 = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this_00
                     );
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_40,peVar2);
  peVar2 = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pdh.m.
                       super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper
            ((QPDFPageLabelDocumentHelper *)
             &odh.m.
              super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,peVar2);
  peVar2 = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pdh.m.
                       super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper
            ((QPDFOutlineDocumentHelper *)
             &afdh.m.
              super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,peVar2);
  peVar2 = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pdh.m.
                       super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper
            ((QPDFAcroFormDocumentHelper *)&discard_contents,peVar2);
  QPDFAcroFormDocumentHelper::generateAppearancesIfNeeded
            ((QPDFAcroFormDocumentHelper *)&discard_contents);
  QPDFPageDocumentHelper::flattenAnnotations((QPDFPageDocumentHelper *)local_40,0,3);
  DiscardContents::DiscardContents((DiscardContents *)&stack0xffffffffffffff48);
  QPDFPageDocumentHelper::getAllPages
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin1,
             (QPDFPageDocumentHelper *)local_40);
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin
                     ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                      &__begin1);
  local_f0._M_current =
       (QPDFPageObjectHelper *)
       std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end
                 ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&local_f0);
    if (!bVar1) break;
    local_100 = __gnu_cxx::
                __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                ::operator*(&__end1);
    QPDFPageObjectHelper::coalesceContentStreams(local_100);
    QPDFPageObjectHelper::parseContents(local_100,(ParserCallbacks *)&stack0xffffffffffffff48);
    QPDFPageObjectHelper::getImages_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                *)&stack0xfffffffffffffed0,local_100);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
            *)&stack0xfffffffffffffed0);
    QPDFPageLabelDocumentHelper::getLabelForPage
              ((QPDFPageLabelDocumentHelper *)
               &page_obj.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (longlong)
               &odh.m.
                super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &page_obj.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_150);
    QPDFObjectHandle::getJSON((QPDFObjectHandle *)&local_180,(int)local_150,true);
    JSON::unparse_abi_cxx11_(&local_170,&local_180);
    std::__cxx11::string::~string((string *)&local_170);
    JSON::~JSON(&local_180);
    __range2 = (vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
               ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_150);
    QPDFOutlineDocumentHelper::getOutlinesForPage
              (&local_198,
               (QPDFOutlineDocumentHelper *)
               &afdh.m.
                super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(QPDFObjGen)__range2);
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
              (&local_198);
    QPDFPageObjectHelper::QPDFPageObjectHelper((QPDFPageObjectHelper *)&__begin2,local_100);
    QPDFAcroFormDocumentHelper::getWidgetAnnotationsForPage
              (&local_1c0,(QPDFAcroFormDocumentHelper *)&discard_contents,
               (QPDFPageObjectHelper *)&__begin2);
    QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&__begin2);
    local_1a8 = &local_1c0;
    __end2 = std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::
             begin(local_1a8);
    aoh = (QPDFAnnotationObjectHelper *)
          std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::end
                    (local_1a8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
                                  *)&aoh);
      if (!bVar1) break;
      local_210 = __gnu_cxx::
                  __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
                  ::operator*(&__end2);
      QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper
                ((QPDFAnnotationObjectHelper *)&e,local_210);
      QPDFAcroFormDocumentHelper::getFieldForAnnotation
                (&local_248,(QPDFAcroFormDocumentHelper *)&discard_contents,
                 (QPDFAnnotationObjectHelper *)&e);
      QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_248);
      QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper((QPDFAnnotationObjectHelper *)&e);
      __gnu_cxx::
      __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
      ::operator++(&__end2);
    }
    page._4_4_ = 4;
    std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
              (&local_1c0);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_150);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  page._4_4_ = 2;
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin1);
  DiscardContents::~DiscardContents((DiscardContents *)&stack0xffffffffffffff48);
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper
            ((QPDFAcroFormDocumentHelper *)&discard_contents);
  QPDFOutlineDocumentHelper::~QPDFOutlineDocumentHelper
            ((QPDFOutlineDocumentHelper *)
             &afdh.m.
              super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper
            ((QPDFPageLabelDocumentHelper *)
             &odh.m.
              super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_40);
  std::shared_ptr<QPDF>::~shared_ptr
            ((shared_ptr<QPDF> *)
             &pdh.m.super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void
FuzzHelper::testPages()
{
    // Parse all content streams, and exercise some helpers that
    // operate on pages.
    std::shared_ptr<QPDF> q = getQpdf();
    QPDFPageDocumentHelper pdh(*q);
    QPDFPageLabelDocumentHelper pldh(*q);
    QPDFOutlineDocumentHelper odh(*q);
    QPDFAcroFormDocumentHelper afdh(*q);
    afdh.generateAppearancesIfNeeded();
    pdh.flattenAnnotations();
    DiscardContents discard_contents;
    int pageno = 0;
    for (auto& page: pdh.getAllPages()) {
        ++pageno;
        try {
            page.coalesceContentStreams();
            page.parseContents(&discard_contents);
            page.getImages();
            pldh.getLabelForPage(pageno);
            QPDFObjectHandle page_obj(page.getObjectHandle());
            page_obj.getJSON(JSON::LATEST, true).unparse();
            odh.getOutlinesForPage(page_obj);

            for (auto& aoh: afdh.getWidgetAnnotationsForPage(page)) {
                afdh.getFieldForAnnotation(aoh);
            }
        } catch (QPDFExc& e) {
            std::cerr << "page " << pageno << ": " << e.what() << '\n';
        }
    }
}